

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O2

optional_ptr<duckdb::Binding,_true> __thiscall
duckdb::BindContext::GetBinding(BindContext *this,string *name,ErrorData *out_error)

{
  optional_ptr<duckdb::Binding,_true> oVar1;
  string sStack_98;
  BindingAlias local_78;
  
  ::std::__cxx11::string::string((string *)&sStack_98,(string *)name);
  BindingAlias::BindingAlias(&local_78,&sStack_98);
  oVar1 = GetBinding(this,&local_78,out_error);
  BindingAlias::~BindingAlias(&local_78);
  ::std::__cxx11::string::~string((string *)&sStack_98);
  return (optional_ptr<duckdb::Binding,_true>)oVar1.ptr;
}

Assistant:

optional_ptr<Binding> BindContext::GetBinding(const string &name, ErrorData &out_error) {
	return GetBinding(BindingAlias(name), out_error);
}